

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths_unix.cpp
# Opt level: O1

QString * QStandardPaths::writableLocation(QString *__return_storage_ptr__,StandardLocation type)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  QLatin1StringView lhs;
  Data *pDVar4;
  int *piVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  storage_type_conflict *unicode;
  bool bVar9;
  __uid_t userId;
  int iVar10;
  CutResult CVar11;
  ushort *puVar12;
  long lVar13;
  QString *pQVar14;
  int __oflag;
  char *pcVar15;
  long in_FS_OFFSET;
  QLatin1StringView needle;
  QStringView rhs;
  QRegularExpressionMatch match;
  long local_150;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  QStringView local_118;
  QRegularExpressionMatch local_100;
  QTextStream local_f8;
  QFile local_e8;
  QString local_d8;
  QStringBuilder<QStringBuilder<QString,_QLatin1String>,_const_QString_&> local_b8;
  QStringBuilder<QString_&,_QLatin1String> local_88;
  QString local_68;
  char *local_48;
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(type) {
  case TempLocation:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QDir::tempPath();
      return __return_storage_ptr__;
    }
    goto LAB_0044b897;
  case HomeLocation:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QDir::homePath();
      return __return_storage_ptr__;
    }
    goto LAB_0044b897;
  case AppLocalDataLocation:
  case GenericDataLocation:
  case AppDataLocation:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    bVar9 = isTestModeEnabled();
    if (bVar9) {
      QDir::homePath();
      pcVar15 = local_88.b.m_data;
      qVar3 = local_88.b.m_size;
      pQVar14 = local_88.a;
      local_88.a = (QString *)0x0;
      local_88.b.m_size = 0;
      local_b8.a.a.d.d._0_4_ = SUB84(pQVar14,0);
      local_b8.a.a.d.d._4_4_ = (undefined4)((ulong)pQVar14 >> 0x20);
      local_b8.a.a.d.ptr._0_4_ = (undefined4)qVar3;
      local_b8.a.a.d.ptr._4_4_ = (undefined4)((ulong)qVar3 >> 0x20);
      local_88.b.m_data = (char *)0x0;
      local_b8.a.a.d.size._0_4_ = SUB84(pcVar15,0);
      local_b8.a.a.d.size._4_4_ = (undefined4)((ulong)pcVar15 >> 0x20);
      local_b8.a.b.m_size = 0xe;
      local_b8.a.b.m_data = "/.qttest/share";
      QStringBuilder<QString,_QLatin1String>::convertTo<QString>(&local_68,&local_b8.a);
LAB_00449e08:
      pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pcVar2 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_68.d.d;
      (__return_storage_ptr__->d).ptr = local_68.d.ptr;
      pcVar15 = (char *)(__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_68.d.size;
      local_68.d.d = (Data *)pQVar1;
      local_68.d.ptr = pcVar2;
      local_68.d.size = (qsizetype)pcVar15;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      piVar5 = (int *)CONCAT44(local_b8.a.a.d.d._4_4_,local_b8.a.a.d.d._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_b8.a.a.d.d._4_4_,local_b8.a.a.d.d._0_4_),2,0x10);
        }
      }
      if ((QArrayData *)local_88.a != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_88.a,2,0x10);
        }
      }
    }
    else {
      qEnvironmentVariable((QString *)&local_b8,"XDG_DATA_HOME");
      pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pcVar2 = (__return_storage_ptr__->d).ptr;
      pDVar4 = (Data *)CONCAT44(local_b8.a.a.d.d._4_4_,local_b8.a.a.d.d._0_4_);
      local_b8.a.a.d.d._0_4_ = SUB84(pQVar1,0);
      local_b8.a.a.d.d._4_4_ = (undefined4)((ulong)pQVar1 >> 0x20);
      (__return_storage_ptr__->d).d = pDVar4;
      (__return_storage_ptr__->d).ptr =
           (char16_t *)CONCAT44(local_b8.a.a.d.ptr._4_4_,local_b8.a.a.d.ptr._0_4_);
      local_b8.a.a.d.ptr._0_4_ = SUB84(pcVar2,0);
      local_b8.a.a.d.ptr._4_4_ = (undefined4)((ulong)pcVar2 >> 0x20);
      qVar3 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size =
           CONCAT44(local_b8.a.a.d.size._4_4_,(undefined4)local_b8.a.a.d.size);
      local_b8.a.a.d.size._0_4_ = (undefined4)qVar3;
      local_b8.a.a.d.size._4_4_ = (undefined4)((ulong)qVar3 >> 0x20);
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      bVar9 = QString::startsWith(__return_storage_ptr__,(QChar)0x2f,CaseSensitive);
      if (!bVar9 && (__return_storage_ptr__->d).ptr != (char16_t *)0x0) {
        pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        if (pQVar1 != (QArrayData *)0x0) {
          LOCK();
          (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar1,2,0x10);
          }
        }
      }
      if ((__return_storage_ptr__->d).size == 0) {
        QDir::homePath();
        pcVar15 = local_88.b.m_data;
        qVar3 = local_88.b.m_size;
        pQVar14 = local_88.a;
        local_88.a = (QString *)0x0;
        local_88.b.m_size = 0;
        local_b8.a.a.d.d._0_4_ = SUB84(pQVar14,0);
        local_b8.a.a.d.d._4_4_ = (undefined4)((ulong)pQVar14 >> 0x20);
        local_b8.a.a.d.ptr._0_4_ = (undefined4)qVar3;
        local_b8.a.a.d.ptr._4_4_ = (undefined4)((ulong)qVar3 >> 0x20);
        local_88.b.m_data = (char *)0x0;
        local_b8.a.a.d.size._0_4_ = SUB84(pcVar15,0);
        local_b8.a.a.d.size._4_4_ = (undefined4)((ulong)pcVar15 >> 0x20);
        local_b8.a.b.m_size = 0xd;
        local_b8.a.b.m_data = "/.local/share";
        QStringBuilder<QString,_QLatin1String>::convertTo<QString>(&local_68,&local_b8.a);
        goto LAB_00449e08;
      }
    }
    if ((type == AppDataLocation) || (type == AppLocalDataLocation)) {
      appendOrganizationAndApp(__return_storage_ptr__);
    }
    break;
  case CacheLocation:
  case GenericCacheLocation:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    bVar9 = isTestModeEnabled();
    if (bVar9) {
      QDir::homePath();
      pcVar15 = local_88.b.m_data;
      qVar3 = local_88.b.m_size;
      pQVar14 = local_88.a;
      local_88.a = (QString *)0x0;
      local_88.b.m_size = 0;
      local_b8.a.a.d.d._0_4_ = SUB84(pQVar14,0);
      local_b8.a.a.d.d._4_4_ = (undefined4)((ulong)pQVar14 >> 0x20);
      local_b8.a.a.d.ptr._0_4_ = (undefined4)qVar3;
      local_b8.a.a.d.ptr._4_4_ = (undefined4)((ulong)qVar3 >> 0x20);
      local_88.b.m_data = (char *)0x0;
      local_b8.a.a.d.size._0_4_ = SUB84(pcVar15,0);
      local_b8.a.a.d.size._4_4_ = (undefined4)((ulong)pcVar15 >> 0x20);
      local_b8.a.b.m_size = 0xe;
      local_b8.a.b.m_data = "/.qttest/cache";
      QStringBuilder<QString,_QLatin1String>::convertTo<QString>(&local_68,&local_b8.a);
LAB_0044a5df:
      pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pcVar2 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_68.d.d;
      (__return_storage_ptr__->d).ptr = local_68.d.ptr;
      pcVar15 = (char *)(__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_68.d.size;
      local_68.d.d = (Data *)pQVar1;
      local_68.d.ptr = pcVar2;
      local_68.d.size = (qsizetype)pcVar15;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      piVar5 = (int *)CONCAT44(local_b8.a.a.d.d._4_4_,local_b8.a.a.d.d._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_b8.a.a.d.d._4_4_,local_b8.a.a.d.d._0_4_),2,0x10);
        }
      }
      if ((QArrayData *)local_88.a != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_88.a,2,0x10);
        }
      }
    }
    else {
      qEnvironmentVariable((QString *)&local_b8,"XDG_CACHE_HOME");
      pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pcVar2 = (__return_storage_ptr__->d).ptr;
      pDVar4 = (Data *)CONCAT44(local_b8.a.a.d.d._4_4_,local_b8.a.a.d.d._0_4_);
      local_b8.a.a.d.d._0_4_ = SUB84(pQVar1,0);
      local_b8.a.a.d.d._4_4_ = (undefined4)((ulong)pQVar1 >> 0x20);
      (__return_storage_ptr__->d).d = pDVar4;
      (__return_storage_ptr__->d).ptr =
           (char16_t *)CONCAT44(local_b8.a.a.d.ptr._4_4_,local_b8.a.a.d.ptr._0_4_);
      local_b8.a.a.d.ptr._0_4_ = SUB84(pcVar2,0);
      local_b8.a.a.d.ptr._4_4_ = (undefined4)((ulong)pcVar2 >> 0x20);
      qVar3 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size =
           CONCAT44(local_b8.a.a.d.size._4_4_,(undefined4)local_b8.a.a.d.size);
      local_b8.a.a.d.size._0_4_ = (undefined4)qVar3;
      local_b8.a.a.d.size._4_4_ = (undefined4)((ulong)qVar3 >> 0x20);
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      bVar9 = QString::startsWith(__return_storage_ptr__,(QChar)0x2f,CaseSensitive);
      if (!bVar9 && (__return_storage_ptr__->d).ptr != (char16_t *)0x0) {
        pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        if (pQVar1 != (QArrayData *)0x0) {
          LOCK();
          (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar1,2,0x10);
          }
        }
      }
      if ((__return_storage_ptr__->d).size == 0) {
        QDir::homePath();
        pcVar15 = local_88.b.m_data;
        qVar3 = local_88.b.m_size;
        pQVar14 = local_88.a;
        local_88.a = (QString *)0x0;
        local_88.b.m_size = 0;
        local_b8.a.a.d.d._0_4_ = SUB84(pQVar14,0);
        local_b8.a.a.d.d._4_4_ = (undefined4)((ulong)pQVar14 >> 0x20);
        local_b8.a.a.d.ptr._0_4_ = (undefined4)qVar3;
        local_b8.a.a.d.ptr._4_4_ = (undefined4)((ulong)qVar3 >> 0x20);
        local_88.b.m_data = (char *)0x0;
        local_b8.a.a.d.size._0_4_ = SUB84(pcVar15,0);
        local_b8.a.a.d.size._4_4_ = (undefined4)((ulong)pcVar15 >> 0x20);
        local_b8.a.b.m_size = (qsizetype)&DAT_00000007;
        local_b8.a.b.m_data = "/.cache";
        QStringBuilder<QString,_QLatin1String>::convertTo<QString>(&local_68,&local_b8.a);
        goto LAB_0044a5df;
      }
    }
    if (type == CacheLocation) {
      appendOrganizationAndApp(__return_storage_ptr__);
    }
    break;
  case RuntimeLocation:
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    qEnvironmentVariable(__return_storage_ptr__,"XDG_RUNTIME_DIR");
    bVar9 = QString::startsWith(__return_storage_ptr__,(QChar)0x2f,CaseSensitive);
    if (!bVar9 && (__return_storage_ptr__->d).ptr != (char16_t *)0x0) {
      pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
    }
    lVar13 = (__return_storage_ptr__->d).size;
    if ((lVar13 != 0) && (bVar9 = checkXdgRuntimeDir(__return_storage_ptr__), bVar9)) break;
    userId = geteuid();
    local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEngine::resolveUserName(&local_68,userId);
    QDir::tempPath();
    qVar3 = local_d8.d.size;
    pcVar2 = local_d8.d.ptr;
    pDVar4 = local_d8.d.d;
    local_d8.d.size = 0;
    local_d8.d.d = (Data *)0x0;
    local_d8.d.ptr = (char16_t *)0x0;
    local_b8.a.a.d.d._0_4_ = SUB84(pDVar4,0);
    local_b8.a.a.d.d._4_4_ = (undefined4)((ulong)pDVar4 >> 0x20);
    local_b8.a.a.d.ptr._0_4_ = SUB84(pcVar2,0);
    local_b8.a.a.d.ptr._4_4_ = (undefined4)((ulong)pcVar2 >> 0x20);
    local_b8.a.a.d.size._0_4_ = (undefined4)qVar3;
    local_b8.a.a.d.size._4_4_ = (undefined4)((ulong)qVar3 >> 0x20);
    local_b8.a.b.m_size = 9;
    local_b8.a.b.m_data = "/runtime-";
    local_b8.b = &local_68;
    QStringBuilder<QStringBuilder<QString,_QLatin1String>,_const_QString_&>::convertTo<QString>
              ((QString *)&local_88,&local_b8);
    pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar2 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = (Data *)local_88.a;
    (__return_storage_ptr__->d).ptr = (char16_t *)local_88.b.m_size;
    pcVar15 = (char *)(__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = (qsizetype)local_88.b.m_data;
    local_88.a = (QString *)pQVar1;
    local_88.b.m_size = (qsizetype)pcVar2;
    local_88.b.m_data = pcVar15;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
    piVar5 = (int *)CONCAT44(local_b8.a.a.d.d._4_4_,local_b8.a.a.d.d._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_b8.a.a.d.d._4_4_,local_b8.a.a.d.d._0_4_),2,0x10);
      }
    }
    if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (lVar13 == 0) {
      local_b8.a.a.d.d._0_4_ = 2;
      local_b8.a.a.d.d._4_4_ = 0;
      local_b8.a.a.d.ptr._0_4_ = 0;
      local_b8.a.a.d.ptr._4_4_ = 0;
      local_b8.a.a.d.size._0_4_ = 0;
      local_b8.a.a.d.size._4_4_ = 0;
      local_b8.a.b.m_size = 0x4ca5a5;
      puVar12 = QString::utf16(__return_storage_ptr__);
      QMessageLogger::warning
                ((QMessageLogger *)&local_b8,
                 "QStandardPaths: XDG_RUNTIME_DIR not set, defaulting to \'%ls\'",puVar12);
    }
    bVar9 = checkXdgRuntimeDir(__return_storage_ptr__);
    if (!bVar9 && (__return_storage_ptr__->d).ptr != (char16_t *)0x0) {
      pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
    }
    goto LAB_0044b0fb;
  case ConfigLocation:
  case GenericConfigLocation:
  case AppConfigLocation:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    bVar9 = isTestModeEnabled();
    if (bVar9) {
      QDir::homePath();
      pcVar15 = local_88.b.m_data;
      qVar3 = local_88.b.m_size;
      pQVar14 = local_88.a;
      local_88.a = (QString *)0x0;
      local_88.b.m_size = 0;
      local_b8.a.a.d.d._0_4_ = SUB84(pQVar14,0);
      local_b8.a.a.d.d._4_4_ = (undefined4)((ulong)pQVar14 >> 0x20);
      local_b8.a.a.d.ptr._0_4_ = (undefined4)qVar3;
      local_b8.a.a.d.ptr._4_4_ = (undefined4)((ulong)qVar3 >> 0x20);
      local_88.b.m_data = (char *)0x0;
      local_b8.a.a.d.size._0_4_ = SUB84(pcVar15,0);
      local_b8.a.a.d.size._4_4_ = (undefined4)((ulong)pcVar15 >> 0x20);
      local_b8.a.b.m_size = 0xf;
      local_b8.a.b.m_data = "/.qttest/config";
      QStringBuilder<QString,_QLatin1String>::convertTo<QString>(&local_68,&local_b8.a);
LAB_00449c1f:
      pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pcVar2 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_68.d.d;
      (__return_storage_ptr__->d).ptr = local_68.d.ptr;
      pcVar15 = (char *)(__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_68.d.size;
      local_68.d.d = (Data *)pQVar1;
      local_68.d.ptr = pcVar2;
      local_68.d.size = (qsizetype)pcVar15;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      piVar5 = (int *)CONCAT44(local_b8.a.a.d.d._4_4_,local_b8.a.a.d.d._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_b8.a.a.d.d._4_4_,local_b8.a.a.d.d._0_4_),2,0x10);
        }
      }
      if ((QArrayData *)local_88.a != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_88.a,2,0x10);
        }
      }
    }
    else {
      qEnvironmentVariable((QString *)&local_b8,"XDG_CONFIG_HOME");
      pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pcVar2 = (__return_storage_ptr__->d).ptr;
      pDVar4 = (Data *)CONCAT44(local_b8.a.a.d.d._4_4_,local_b8.a.a.d.d._0_4_);
      local_b8.a.a.d.d._0_4_ = SUB84(pQVar1,0);
      local_b8.a.a.d.d._4_4_ = (undefined4)((ulong)pQVar1 >> 0x20);
      (__return_storage_ptr__->d).d = pDVar4;
      (__return_storage_ptr__->d).ptr =
           (char16_t *)CONCAT44(local_b8.a.a.d.ptr._4_4_,local_b8.a.a.d.ptr._0_4_);
      local_b8.a.a.d.ptr._0_4_ = SUB84(pcVar2,0);
      local_b8.a.a.d.ptr._4_4_ = (undefined4)((ulong)pcVar2 >> 0x20);
      qVar3 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size =
           CONCAT44(local_b8.a.a.d.size._4_4_,(undefined4)local_b8.a.a.d.size);
      local_b8.a.a.d.size._0_4_ = (undefined4)qVar3;
      local_b8.a.a.d.size._4_4_ = (undefined4)((ulong)qVar3 >> 0x20);
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      bVar9 = QString::startsWith(__return_storage_ptr__,(QChar)0x2f,CaseSensitive);
      if (!bVar9 && (__return_storage_ptr__->d).ptr != (char16_t *)0x0) {
        pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        if (pQVar1 != (QArrayData *)0x0) {
          LOCK();
          (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar1,2,0x10);
          }
        }
      }
      if ((__return_storage_ptr__->d).size == 0) {
        QDir::homePath();
        pcVar15 = local_88.b.m_data;
        qVar3 = local_88.b.m_size;
        pQVar14 = local_88.a;
        local_88.a = (QString *)0x0;
        local_88.b.m_size = 0;
        local_b8.a.a.d.d._0_4_ = SUB84(pQVar14,0);
        local_b8.a.a.d.d._4_4_ = (undefined4)((ulong)pQVar14 >> 0x20);
        local_b8.a.a.d.ptr._0_4_ = (undefined4)qVar3;
        local_b8.a.a.d.ptr._4_4_ = (undefined4)((ulong)qVar3 >> 0x20);
        local_88.b.m_data = (char *)0x0;
        local_b8.a.a.d.size._0_4_ = SUB84(pcVar15,0);
        local_b8.a.a.d.size._4_4_ = (undefined4)((ulong)pcVar15 >> 0x20);
        local_b8.a.b.m_size = 8;
        local_b8.a.b.m_data = "/.config";
        QStringBuilder<QString,_QLatin1String>::convertTo<QString>(&local_68,&local_b8.a);
        goto LAB_00449c1f;
      }
    }
    if (type == AppConfigLocation) {
      appendOrganizationAndApp(__return_storage_ptr__);
    }
    break;
  default:
    local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    qEnvironmentVariable(&local_68,"XDG_CONFIG_HOME");
    bVar9 = QString::startsWith(&local_68,(QChar)0x2f,CaseSensitive);
    pDVar4 = local_68.d.d;
    if (!bVar9 && local_68.d.ptr != (char16_t *)0x0) {
      local_68.d.d = (Data *)0x0;
      local_68.d.ptr = (char16_t *)0x0;
      local_68.d.size = 0;
      if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
        }
      }
    }
    if ((char *)local_68.d.size == (char *)0x0) {
      QDir::homePath();
      qVar3 = local_d8.d.size;
      pcVar2 = local_d8.d.ptr;
      pDVar4 = local_d8.d.d;
      local_d8.d.d = (Data *)0x0;
      local_d8.d.ptr = (char16_t *)0x0;
      local_b8.a.a.d.d._0_4_ = SUB84(pDVar4,0);
      local_b8.a.a.d.d._4_4_ = (undefined4)((ulong)pDVar4 >> 0x20);
      local_b8.a.a.d.ptr._0_4_ = SUB84(pcVar2,0);
      local_b8.a.a.d.ptr._4_4_ = (undefined4)((ulong)pcVar2 >> 0x20);
      local_d8.d.size = 0;
      local_b8.a.a.d.size._0_4_ = (undefined4)qVar3;
      local_b8.a.a.d.size._4_4_ = (undefined4)((ulong)qVar3 >> 0x20);
      local_b8.a.b.m_size = 8;
      local_b8.a.b.m_data = "/.config";
      QStringBuilder<QString,_QLatin1String>::convertTo<QString>((QString *)&local_88,&local_b8.a);
      pcVar2 = local_68.d.ptr;
      pDVar4 = local_68.d.d;
      pcVar15 = local_88.b.m_data;
      pQVar14 = local_88.a;
      local_88.a = (QString *)local_68.d.d;
      local_68.d.d = (Data *)pQVar14;
      local_68.d.ptr = (char16_t *)local_88.b.m_size;
      local_88.b.m_size = (qsizetype)pcVar2;
      local_88.b.m_data = (char *)local_68.d.size;
      local_68.d.size = (qsizetype)pcVar15;
      if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
        }
      }
      piVar5 = (int *)CONCAT44(local_b8.a.a.d.d._4_4_,local_b8.a.a.d.d._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_b8.a.a.d.d._4_4_,local_b8.a.a.d.d._0_4_),2,0x10);
        }
      }
      if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    local_e8.super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject =
         (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d =
         (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.b.m_size = 0xf;
    local_88.b.m_data = "/user-dirs.dirs";
    local_88.a = (QString *)&local_68;
    QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>((QString *)&local_b8,&local_88);
    QFile::QFile(&local_e8,(QString *)&local_b8);
    piVar5 = (int *)CONCAT44(local_b8.a.a.d.d._4_4_,local_b8.a.a.d.d._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_b8.a.a.d.d._4_4_,local_b8.a.a.d.d._0_4_),2,0x10);
      }
    }
    pcVar15 = "DESKTOP";
    local_150 = 7;
    bVar9 = false;
    switch((ulong)type) {
    case 0:
      goto switchD_0044a013_caseD_0;
    case 1:
      pcVar15 = "DOCUMENTS";
LAB_0044a7d9:
      local_150 = 9;
      break;
    case 2:
    case 3:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
switchD_0044a013_caseD_2:
      bVar9 = true;
      local_150 = 0;
      pcVar15 = (char *)0x0;
      goto switchD_0044a013_caseD_0;
    case 4:
      pcVar15 = "MUSIC";
      local_150 = 5;
      break;
    case 5:
      pcVar15 = "VIDEOS";
      local_150 = 6;
      break;
    case 6:
      pcVar15 = "PICTURES";
      goto LAB_0044a81c;
    case 0xe:
      pcVar15 = "DOWNLOAD";
LAB_0044a81c:
      local_150 = 8;
      break;
    default:
      if (type != PublicShareLocation) {
        if (type != TemplatesLocation) goto switchD_0044a013_caseD_2;
        pcVar15 = "TEMPLATES";
        goto LAB_0044a7d9;
      }
      pcVar15 = "PUBLICSHARE";
      local_150 = 0xb;
    }
    bVar9 = false;
switchD_0044a013_caseD_0:
    if (((bVar9) || (bVar9 = isTestModeEnabled(), bVar9)) ||
       (iVar10 = QFile::open(&local_e8,(char *)0x1,__oflag), (char)iVar10 == '\0')) {
LAB_0044ac04:
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      if (type < StateLocation) {
        pQVar14 = (QString *)
                  (*(code *)(&DAT_005afaa8 + *(int *)(&DAT_005afaa8 + (ulong)type * 4)))();
        return pQVar14;
      }
    }
    else {
      local_f8._vptr_QTextStream = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.d_ptr._M_t.
      super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
      super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
      super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl =
           (__uniq_ptr_data<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>,_true,_true>
           )&DAT_aaaaaaaaaaaaaaaa;
      ::QTextStream::QTextStream(&local_f8,(QIODevice *)&local_e8);
      if ((writableLocation(QStandardPaths::StandardLocation)::exp == '\0') &&
         (iVar10 = __cxa_guard_acquire(&writableLocation(QStandardPaths::StandardLocation)::exp),
         iVar10 != 0)) {
        local_b8.a.a.d.d._0_4_ = 0;
        local_b8.a.a.d.d._4_4_ = 0;
        local_b8.a.a.d.ptr._0_4_ = 0x5afefe;
        local_b8.a.a.d.ptr._4_4_ = 0;
        local_b8.a.a.d.size._0_4_ = 0x13;
        local_b8.a.a.d.size._4_4_ = 0;
        QRegularExpression::QRegularExpression
                  (&writableLocation::exp,(QString *)&local_b8,(PatternOptions)0x0);
        piVar5 = (int *)CONCAT44(local_b8.a.a.d.d._4_4_,local_b8.a.a.d.d._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT44(local_b8.a.a.d.d._4_4_,local_b8.a.a.d.d._0_4_),2,0x10)
            ;
          }
        }
        __cxa_atexit(QRegularExpression::~QRegularExpression,&writableLocation::exp,&__dso_handle);
        __cxa_guard_release(&writableLocation(QStandardPaths::StandardLocation)::exp);
      }
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      while (uVar8 = local_128, uVar7 = uStack_130, uVar6 = local_138,
            bVar9 = ::QTextStream::atEnd(&local_f8), !bVar9) {
        ::QTextStream::readLine((QString *)&local_88,&local_f8,0);
        local_100.d.d.ptr =
             (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)&DAT_aaaaaaaaaaaaaaaa;
        QRegularExpression::match
                  ((QRegularExpression *)&local_100,(QString *)&writableLocation::exp,
                   (qsizetype)&local_88,NormalMatch,(MatchOptions)0x0);
        bVar9 = QRegularExpressionMatch::hasMatch(&local_100);
        if (((bVar9) &&
            (rhs = QRegularExpressionMatch::capturedView(&local_100,1), local_150 == rhs.m_size)) &&
           (lhs.m_data = pcVar15, lhs.m_size = local_150, bVar9 = QtPrivate::equalStrings(lhs,rhs),
           bVar9)) {
          local_118.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
          local_118.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_118 = QRegularExpressionMatch::capturedView(&local_100,2);
          lVar13 = local_118.m_size;
          if (((2 < lVar13) && (*local_118.m_data == L'\"')) &&
             (local_118.m_data[lVar13 + -1] == L'\"')) {
            local_118 = QStringView::mid(&local_118,1,lVar13 + -2);
          }
          qVar3 = local_118.m_size;
          unicode = local_118.m_data;
          needle.m_data = "$HOME";
          needle.m_size = 5;
          bVar9 = QtPrivate::startsWith(local_118,needle,CaseSensitive);
          if (bVar9) {
            QDir::homePath();
            local_40 = 5;
            local_48 = (char *)0xffffffffffffffff;
            CVar11 = QtPrivate::QContainerImplHelper::mid
                               (local_118.m_size,&local_40,(qsizetype *)&local_48);
            local_b8.a.b.m_data = (char *)0x0;
            local_b8.a.b.m_size = (qsizetype)(char *)0x0;
            if (CVar11 != Null) {
              local_b8.a.b.m_data = (char *)(local_118.m_data + local_40);
              local_b8.a.b.m_size = (qsizetype)local_48;
            }
            local_138 = 0;
            uStack_130 = 0;
            local_b8.a.a.d.d._0_4_ = (undefined4)uVar6;
            local_b8.a.a.d.d._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
            local_b8.a.a.d.ptr._0_4_ = (undefined4)uVar7;
            local_b8.a.a.d.ptr._4_4_ = (undefined4)((ulong)uVar7 >> 0x20);
            local_128 = 0;
            local_b8.a.a.d.size._0_4_ = (undefined4)uVar8;
            local_b8.a.a.d.size._4_4_ = (undefined4)((ulong)uVar8 >> 0x20);
            QStringBuilder<QString,_QStringView>::convertTo<QString>
                      (&local_d8,(QStringBuilder<QString,_QStringView> *)&local_b8);
            pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
            pcVar2 = (__return_storage_ptr__->d).ptr;
            (__return_storage_ptr__->d).d = local_d8.d.d;
            (__return_storage_ptr__->d).ptr = local_d8.d.ptr;
            qVar3 = (__return_storage_ptr__->d).size;
            (__return_storage_ptr__->d).size = local_d8.d.size;
            local_d8.d.d = (Data *)pQVar1;
            local_d8.d.ptr = pcVar2;
            local_d8.d.size = qVar3;
            if (pQVar1 != (QArrayData *)0x0) {
              LOCK();
              (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar1,2,0x10);
              }
            }
            piVar5 = (int *)CONCAT44(local_b8.a.a.d.d._4_4_,local_b8.a.a.d.d._0_4_);
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (*piVar5 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_b8.a.a.d.d._4_4_,local_b8.a.a.d.d._0_4_),2,
                           0x10);
              }
            }
          }
          else {
            QString::QString((QString *)&local_b8,(QChar *)unicode,qVar3);
            pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
            pcVar2 = (__return_storage_ptr__->d).ptr;
            pDVar4 = (Data *)CONCAT44(local_b8.a.a.d.d._4_4_,local_b8.a.a.d.d._0_4_);
            local_b8.a.a.d.d._0_4_ = SUB84(pQVar1,0);
            local_b8.a.a.d.d._4_4_ = (undefined4)((ulong)pQVar1 >> 0x20);
            (__return_storage_ptr__->d).d = pDVar4;
            (__return_storage_ptr__->d).ptr =
                 (char16_t *)CONCAT44(local_b8.a.a.d.ptr._4_4_,local_b8.a.a.d.ptr._0_4_);
            local_b8.a.a.d.ptr._0_4_ = SUB84(pcVar2,0);
            local_b8.a.a.d.ptr._4_4_ = (undefined4)((ulong)pcVar2 >> 0x20);
            qVar3 = (__return_storage_ptr__->d).size;
            (__return_storage_ptr__->d).size =
                 CONCAT44(local_b8.a.a.d.size._4_4_,(undefined4)local_b8.a.a.d.size);
            local_b8.a.a.d.size._0_4_ = (undefined4)qVar3;
            local_b8.a.a.d.size._4_4_ = (undefined4)((ulong)qVar3 >> 0x20);
            if (pQVar1 != (QArrayData *)0x0) {
              LOCK();
              (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar1,2,0x10);
              }
            }
          }
          if ((1 < (ulong)(__return_storage_ptr__->d).size) &&
             (bVar9 = QString::endsWith(__return_storage_ptr__,(QChar)0x2f,CaseSensitive), bVar9)) {
            QString::chop(__return_storage_ptr__,1);
          }
        }
        QRegularExpressionMatch::~QRegularExpressionMatch(&local_100);
        if ((QArrayData *)local_88.a != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate((QArrayData *)local_88.a,2,0x10);
          }
        }
      }
      if ((__return_storage_ptr__->d).ptr == (char16_t *)0x0) {
        QString::~QString(__return_storage_ptr__);
        ::QTextStream::~QTextStream(&local_f8);
        goto LAB_0044ac04;
      }
      ::QTextStream::~QTextStream(&local_f8);
    }
    QFile::~QFile(&local_e8);
LAB_0044b0fb:
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
    break;
  case StateLocation:
  case GenericStateLocation:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    bVar9 = isTestModeEnabled();
    if (bVar9) {
      QDir::homePath();
      pcVar15 = local_88.b.m_data;
      qVar3 = local_88.b.m_size;
      pQVar14 = local_88.a;
      local_88.a = (QString *)0x0;
      local_88.b.m_size = 0;
      local_b8.a.a.d.d._0_4_ = SUB84(pQVar14,0);
      local_b8.a.a.d.d._4_4_ = (undefined4)((ulong)pQVar14 >> 0x20);
      local_b8.a.a.d.ptr._0_4_ = (undefined4)qVar3;
      local_b8.a.a.d.ptr._4_4_ = (undefined4)((ulong)qVar3 >> 0x20);
      local_88.b.m_data = (char *)0x0;
      local_b8.a.a.d.size._0_4_ = SUB84(pcVar15,0);
      local_b8.a.a.d.size._4_4_ = (undefined4)((ulong)pcVar15 >> 0x20);
      local_b8.a.b.m_size = 0xe;
      local_b8.a.b.m_data = "/.qttest/state";
      QStringBuilder<QString,_QLatin1String>::convertTo<QString>(&local_68,&local_b8.a);
LAB_0044a3f6:
      pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pcVar2 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_68.d.d;
      (__return_storage_ptr__->d).ptr = local_68.d.ptr;
      pcVar15 = (char *)(__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_68.d.size;
      local_68.d.d = (Data *)pQVar1;
      local_68.d.ptr = pcVar2;
      local_68.d.size = (qsizetype)pcVar15;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      piVar5 = (int *)CONCAT44(local_b8.a.a.d.d._4_4_,local_b8.a.a.d.d._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_b8.a.a.d.d._4_4_,local_b8.a.a.d.d._0_4_),2,0x10);
        }
      }
      if ((QArrayData *)local_88.a != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_88.a,2,0x10);
        }
      }
    }
    else {
      qEnvironmentVariable((QString *)&local_b8,"XDG_STATE_HOME");
      pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pcVar2 = (__return_storage_ptr__->d).ptr;
      pDVar4 = (Data *)CONCAT44(local_b8.a.a.d.d._4_4_,local_b8.a.a.d.d._0_4_);
      local_b8.a.a.d.d._0_4_ = SUB84(pQVar1,0);
      local_b8.a.a.d.d._4_4_ = (undefined4)((ulong)pQVar1 >> 0x20);
      (__return_storage_ptr__->d).d = pDVar4;
      (__return_storage_ptr__->d).ptr =
           (char16_t *)CONCAT44(local_b8.a.a.d.ptr._4_4_,local_b8.a.a.d.ptr._0_4_);
      local_b8.a.a.d.ptr._0_4_ = SUB84(pcVar2,0);
      local_b8.a.a.d.ptr._4_4_ = (undefined4)((ulong)pcVar2 >> 0x20);
      qVar3 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size =
           CONCAT44(local_b8.a.a.d.size._4_4_,(undefined4)local_b8.a.a.d.size);
      local_b8.a.a.d.size._0_4_ = (undefined4)qVar3;
      local_b8.a.a.d.size._4_4_ = (undefined4)((ulong)qVar3 >> 0x20);
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      bVar9 = QString::startsWith(__return_storage_ptr__,(QChar)0x2f,CaseSensitive);
      if (!bVar9 && (__return_storage_ptr__->d).ptr != (char16_t *)0x0) {
        pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        if (pQVar1 != (QArrayData *)0x0) {
          LOCK();
          (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar1,2,0x10);
          }
        }
      }
      if ((__return_storage_ptr__->d).size == 0) {
        QDir::homePath();
        pcVar15 = local_88.b.m_data;
        qVar3 = local_88.b.m_size;
        pQVar14 = local_88.a;
        local_88.a = (QString *)0x0;
        local_88.b.m_size = 0;
        local_b8.a.a.d.d._0_4_ = SUB84(pQVar14,0);
        local_b8.a.a.d.d._4_4_ = (undefined4)((ulong)pQVar14 >> 0x20);
        local_b8.a.a.d.ptr._0_4_ = (undefined4)qVar3;
        local_b8.a.a.d.ptr._4_4_ = (undefined4)((ulong)qVar3 >> 0x20);
        local_88.b.m_data = (char *)0x0;
        local_b8.a.a.d.size._0_4_ = SUB84(pcVar15,0);
        local_b8.a.a.d.size._4_4_ = (undefined4)((ulong)pcVar15 >> 0x20);
        local_b8.a.b.m_size = 0xd;
        local_b8.a.b.m_data = "/.local/state";
        QStringBuilder<QString,_QLatin1String>::convertTo<QString>(&local_68,&local_b8.a);
        goto LAB_0044a3f6;
      }
    }
    if (type == StateLocation) {
      appendOrganizationAndApp(__return_storage_ptr__);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0044b897:
  __stack_chk_fail();
}

Assistant:

QString QStandardPaths::writableLocation(StandardLocation type)
{
    switch (type) {
    case HomeLocation:
        return QDir::homePath();
    case TempLocation:
        return QDir::tempPath();
    case CacheLocation:
    case GenericCacheLocation:
    {
        QString xdgCacheHome;
        if (isTestModeEnabled()) {
            xdgCacheHome = QDir::homePath() + "/.qttest/cache"_L1;
        } else {
            // http://standards.freedesktop.org/basedir-spec/basedir-spec-0.6.html
            xdgCacheHome = qEnvironmentVariable("XDG_CACHE_HOME");
            if (!xdgCacheHome.startsWith(u'/'))
                xdgCacheHome.clear(); // spec says relative paths should be ignored

            if (xdgCacheHome.isEmpty())
                xdgCacheHome = QDir::homePath() + "/.cache"_L1;
        }
        if (type == QStandardPaths::CacheLocation)
            appendOrganizationAndApp(xdgCacheHome);
        return xdgCacheHome;
    }
    case StateLocation:
    case GenericStateLocation:
    {
        QString xdgStateHome;
        if (isTestModeEnabled()) {
            xdgStateHome = QDir::homePath() + "/.qttest/state"_L1;
        } else {
            // http://standards.freedesktop.org/basedir-spec/basedir-spec-0.8.html
            xdgStateHome = qEnvironmentVariable("XDG_STATE_HOME");
            if (!xdgStateHome.startsWith(u'/'))
                xdgStateHome.clear(); // spec says relative paths should be ignored

            if (xdgStateHome.isEmpty())
                xdgStateHome = QDir::homePath() + "/.local/state"_L1;
        }
        if (type == QStandardPaths::StateLocation)
            appendOrganizationAndApp(xdgStateHome);
        return xdgStateHome;
    }
    case AppDataLocation:
    case AppLocalDataLocation:
    case GenericDataLocation:
    {
        QString xdgDataHome;
        if (isTestModeEnabled()) {
            xdgDataHome = QDir::homePath() + "/.qttest/share"_L1;
        } else {
            xdgDataHome = qEnvironmentVariable("XDG_DATA_HOME");
            if (!xdgDataHome.startsWith(u'/'))
                xdgDataHome.clear(); // spec says relative paths should be ignored

            if (xdgDataHome.isEmpty())
                xdgDataHome = QDir::homePath() + "/.local/share"_L1;
        }
        if (type == AppDataLocation || type == AppLocalDataLocation)
            appendOrganizationAndApp(xdgDataHome);
        return xdgDataHome;
    }
    case ConfigLocation:
    case GenericConfigLocation:
    case AppConfigLocation:
    {
        QString xdgConfigHome;
        if (isTestModeEnabled()) {
            xdgConfigHome = QDir::homePath() + "/.qttest/config"_L1;
        } else {
            // http://standards.freedesktop.org/basedir-spec/latest/
            xdgConfigHome = qEnvironmentVariable("XDG_CONFIG_HOME");
            if (!xdgConfigHome.startsWith(u'/'))
                xdgConfigHome.clear(); // spec says relative paths should be ignored

            if (xdgConfigHome.isEmpty())
                xdgConfigHome = QDir::homePath() + "/.config"_L1;
        }
        if (type == AppConfigLocation)
            appendOrganizationAndApp(xdgConfigHome);
        return xdgConfigHome;
    }
    case RuntimeLocation:
    {
        QString xdgRuntimeDir = qEnvironmentVariable("XDG_RUNTIME_DIR");
        if (!xdgRuntimeDir.startsWith(u'/'))
            xdgRuntimeDir.clear(); // spec says relative paths should be ignored

        bool fromEnv = !xdgRuntimeDir.isEmpty();
        if (xdgRuntimeDir.isEmpty() || !checkXdgRuntimeDir(xdgRuntimeDir)) {
            // environment variable not set or is set to something unsuitable
            const uint myUid = uint(geteuid());
            const QString userName = QFileSystemEngine::resolveUserName(myUid);
            xdgRuntimeDir = QDir::tempPath() + "/runtime-"_L1 + userName;

            if (!fromEnv) {
#ifndef Q_OS_WASM
                qWarning("QStandardPaths: XDG_RUNTIME_DIR not set, defaulting to '%ls'", qUtf16Printable(xdgRuntimeDir));
#endif
            }

            if (!checkXdgRuntimeDir(xdgRuntimeDir))
                xdgRuntimeDir.clear();
        }

        return xdgRuntimeDir;
    }
    default:
        break;
    }

#if QT_CONFIG(regularexpression)
    // http://www.freedesktop.org/wiki/Software/xdg-user-dirs
    QString xdgConfigHome = qEnvironmentVariable("XDG_CONFIG_HOME");
    if (!xdgConfigHome.startsWith(u'/'))
        xdgConfigHome.clear(); // spec says relative paths should be ignored

    if (xdgConfigHome.isEmpty())
        xdgConfigHome = QDir::homePath() + "/.config"_L1;
    QFile file(xdgConfigHome + "/user-dirs.dirs"_L1);
    const QLatin1StringView key = xdg_key_name(type);
    if (!key.isEmpty() && !isTestModeEnabled() && file.open(QIODevice::ReadOnly)) {
        QTextStream stream(&file);
        // Only look for lines like: XDG_DESKTOP_DIR="$HOME/Desktop"
        static const QRegularExpression exp(u"^XDG_(.*)_DIR=(.*)$"_s);
        QString result;
        while (!stream.atEnd()) {
            const QString &line = stream.readLine();
            QRegularExpressionMatch match = exp.match(line);
            if (match.hasMatch() && match.capturedView(1) == key) {
                QStringView value = match.capturedView(2);
                if (value.size() > 2
                    && value.startsWith(u'\"')
                    && value.endsWith(u'\"'))
                    value = value.mid(1, value.size() - 2);
                // value can start with $HOME
                if (value.startsWith("$HOME"_L1))
                    result = QDir::homePath() + value.mid(5);
                else
                    result = value.toString();
                if (result.size() > 1 && result.endsWith(u'/'))
                    result.chop(1);
            }
        }
        if (!result.isNull())
            return result;
    }
#endif // QT_CONFIG(regularexpression)

    QString path;
    switch (type) {
    case DesktopLocation:
        path = QDir::homePath() + "/Desktop"_L1;
        break;
    case DocumentsLocation:
        path = QDir::homePath() + "/Documents"_L1;
       break;
    case PicturesLocation:
        path = QDir::homePath() + "/Pictures"_L1;
        break;

    case FontsLocation:
        path = writableLocation(GenericDataLocation) + "/fonts"_L1;
        break;

    case MusicLocation:
        path = QDir::homePath() + "/Music"_L1;
        break;

    case MoviesLocation:
        path = QDir::homePath() + "/Videos"_L1;
        break;
    case DownloadLocation:
        path = QDir::homePath() + "/Downloads"_L1;
        break;
    case ApplicationsLocation:
        path = writableLocation(GenericDataLocation) + "/applications"_L1;
        break;

    case PublicShareLocation:
        path = QDir::homePath() + "/Public"_L1;
        break;

    case TemplatesLocation:
        path = QDir::homePath() + "/Templates"_L1;
        break;

    default:
        break;
    }

    return path;
}